

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple9_rle.h
# Opt level: O0

uint32_t * __thiscall
FastPForLib::Simple9_RLE<true>::decodeArray
          (Simple9_RLE<true> *this,uint32_t *input,size_t param_3,uint32_t *out,size_t *nvalue)

{
  uint outCount;
  size_t req;
  ulong uVar1;
  uint32_t *in_RCX;
  uint *in_RSI;
  ulong *in_R8;
  size_t count;
  size_t actualvalue;
  uint32_t markednvalue;
  NotEnoughStorage *in_stack_ffffffffffffffb0;
  ulong uVar2;
  
  outCount = *in_RSI;
  if (*in_R8 < (ulong)outCount) {
    req = __cxa_allocate_exception(0x18);
    NotEnoughStorage::NotEnoughStorage(in_stack_ffffffffffffffb0,req);
    __cxa_throw(req,&NotEnoughStorage::typeinfo,NotEnoughStorage::~NotEnoughStorage);
  }
  uVar1 = (ulong)outCount;
  if (*in_R8 < uVar1) {
    fprintf(_stderr,"possible overrun\n");
  }
  uVar2 = uVar1;
  Simple9_Codec::Decompress(in_RSI + 1,0,in_RCX,0,outCount);
  *in_R8 = uVar1;
  return in_RSI + 1 + uVar2;
}

Assistant:

const uint32_t *decodeArray(const uint32_t *input, const size_t,
                              uint32_t *out, size_t &nvalue) {
    uint32_t markednvalue;
    if (MarkLength) {
      markednvalue = *input++;
      if (markednvalue > nvalue)
        throw NotEnoughStorage(markednvalue);
    }
    const size_t actualvalue = MarkLength ? markednvalue : nvalue;
    if (nvalue < actualvalue) {
      fprintf(stderr, "possible overrun\n");
    }
    auto count = actualvalue;
    Simple9_Codec::Decompress(input, 0, out, 0, uint32_t(count));
    nvalue = MarkLength ? actualvalue : count;
    input += count;
    return input;
  }